

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O1

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
ParseBrokenMessageSet<proto2_unittest::TestAllTypes>::TestBody
          (ParseBrokenMessageSet<proto2_unittest::TestAllTypes> *this)

{
  bool bVar1;
  pointer *__ptr_2;
  pointer *__ptr;
  char *in_R9;
  string_view data;
  AssertionResult gtest_ar_;
  string input;
  TestMessageSet message_set;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a8;
  AssertHelper local_a0;
  internal local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  long *local_88;
  size_t local_80;
  long local_78 [2];
  string local_68;
  TestMessageSet local_48;
  
  proto2_wireformat_unittest::TestMessageSet::TestMessageSet(&local_48,(Arena *)0x0);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"goodbye","");
  data._M_str = (char *)local_88;
  data._M_len = local_80;
  bVar1 = MessageLite::ParseFromString((MessageLite *)&local_48,data);
  local_98[0] = (internal)!bVar1;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,local_98,(AssertionResult *)"message_set.ParseFromString(input)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x357,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._M_head_impl + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  proto2_wireformat_unittest::TestMessageSet::~TestMessageSet(&local_48);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, ParseBrokenMessageSet) {
  typename TestFixture::TestMessageSet message_set;
  std::string input("goodbye");  // Invalid wire format data.
  EXPECT_FALSE(message_set.ParseFromString(input));
}